

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-validator.cpp
# Opt level: O3

ostringstream * __thiscall
wasm::ValidationInfo::printFailureHeader_abi_cxx11_(ValidationInfo *this,Function *func)

{
  ostringstream *stream;
  char *in_RCX;
  long lVar1;
  char *pcVar2;
  Name name;
  
  stream = getStream_abi_cxx11_(this,func);
  if (this->quiet == false) {
    Colors::outputColorCode((ostream *)stream,"\x1b[31m");
    if (func == (Function *)0x0) {
      pcVar2 = "[wasm-validator error in module] ";
      lVar1 = 0x21;
    }
    else {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)stream,"[wasm-validator error in function ",0x22);
      Colors::outputColorCode((ostream *)stream,"\x1b[32m");
      name.super_IString.str._M_str = in_RCX;
      name.super_IString.str._M_len =
           (size_t)(func->super_Importable).super_Named.name.super_IString.str._M_str;
      wasm::operator<<((wasm *)stream,
                       (ostream *)(func->super_Importable).super_Named.name.super_IString.str._M_len
                       ,name);
      Colors::outputColorCode((ostream *)stream,"\x1b[31m");
      pcVar2 = "] ";
      lVar1 = 2;
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)stream,pcVar2,lVar1);
    Colors::outputColorCode((ostream *)stream,"\x1b[0m");
  }
  return stream;
}

Assistant:

std::ostringstream& printFailureHeader(Function* func) {
    auto& stream = getStream(func);
    if (quiet) {
      return stream;
    }
    Colors::red(stream);
    if (func) {
      stream << "[wasm-validator error in function ";
      Colors::green(stream);
      stream << func->name;
      Colors::red(stream);
      stream << "] ";
    } else {
      stream << "[wasm-validator error in module] ";
    }
    Colors::normal(stream);
    return stream;
  }